

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_4::(anonymous_namespace)::ApplyS<unsigned_short,3>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint *puVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  int local_48;
  
  iVar6 = k->v1;
  if (iVar6 != k->v2) {
    fVar1 = k->A;
    local_48 = -iVar6;
    do {
      iVar2 = k->rowlen;
      iVar3 = k->u1;
      iVar8 = (iVar2 - iVar6) - k->w2;
      if (iVar8 < iVar3) {
        iVar8 = iVar3;
      }
      iVar7 = (iVar2 - iVar6) - k->w1;
      if (k->u2 < iVar7) {
        iVar7 = k->u2;
      }
      iVar7 = (iVar7 - iVar8) * nTxChan;
      if (0 < iVar7) {
        fVar12 = (float)iVar8 - k->u;
        fVar11 = (float)iVar6 - k->v;
        fVar13 = fVar12 * k->A * fVar12 + (k->B * fVar12 + k->C * fVar11) * fVar11;
        fVar11 = (fVar12 + fVar12 + 1.0) * k->A + fVar11 * k->B;
        iVar5 = (iVar2 + local_48) - k->w2;
        if (iVar5 < iVar3) {
          iVar5 = iVar3;
        }
        puVar9 = (uint *)((long)data + (long)((iVar5 + iVar2 * iVar6) * nTxChan) * 2);
        do {
          if (fVar13 < 1.0) {
            fVar12 = expf(fVar13 * -6.125);
            fVar12 = fVar12 * k->wscale;
            k->weight = k->weight + fVar12;
            uVar4 = *puVar9;
            auVar10._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
            auVar10._4_2_ = (short)(uVar4 >> 0x10);
            auVar10._0_4_ = uVar4;
            *(ulong *)result =
                 CONCAT44(fVar12 * (float)auVar10._4_4_ +
                          (float)((ulong)*(undefined8 *)result >> 0x20),
                          fVar12 * (float)(uVar4 & 0xffff) + (float)*(undefined8 *)result);
            result[2] = (float)(ushort)puVar9[1] * fVar12 + result[2];
          }
          fVar13 = fVar13 + fVar11;
          fVar11 = fVar11 + fVar1 + fVar1;
          puVar9 = (uint *)((long)puVar9 + (long)nTxChan * 2);
        } while (puVar9 < (uint *)((long)data +
                                  (long)iVar7 * 2 + (long)((iVar8 + iVar2 * iVar6) * nTxChan) * 2));
      }
      iVar6 = iVar6 + 1;
      local_48 = local_48 + -1;
    } while (iVar6 != k->v2);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }